

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMockerBase<void_(unsigned_short,_unsigned_char)>::PerformDefaultAction
          (FunctionMockerBase<void_(unsigned_short,_unsigned_char)> *this,type args,
          string *call_description)

{
  OnCallSpec<void_(unsigned_short,_unsigned_char)> *this_00;
  Action<void_(unsigned_short,_unsigned_char)> *this_01;
  string message;
  ArgumentTuple local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<void_(unsigned_short,_unsigned_char)> *)0x0) {
    std::operator+(&local_30,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    this_01 = OnCallSpec<void_(unsigned_short,_unsigned_char)>::GetAction(this_00);
    local_34.super__Tuple_impl<0UL,_unsigned_short,_unsigned_char>.
    super__Tuple_impl<1UL,_unsigned_char>.super__Head_base<1UL,_unsigned_char,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_char,_false>)
         (args->super__Tuple_impl<0UL,_unsigned_short,_unsigned_char>).
         super__Tuple_impl<1UL,_unsigned_char>.super__Head_base<1UL,_unsigned_char,_false>.
         _M_head_impl;
    local_34.super__Tuple_impl<0UL,_unsigned_short,_unsigned_char>.
    super__Head_base<0UL,_unsigned_short,_false>._M_head_impl =
         (args->super__Tuple_impl<0UL,_unsigned_short,_unsigned_char>).
         super__Head_base<0UL,_unsigned_short,_false>._M_head_impl;
    Action<void_(unsigned_short,_unsigned_char)>::Perform(this_01,&local_34);
  }
  return;
}

Assistant:

Result PerformDefaultAction(
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args,
      const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(internal::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }